

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
SharedPtrTests_self_Self3_Test::~SharedPtrTests_self_Self3_Test
          (SharedPtrTests_self_Self3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_self, Self3) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> t1(a);
	std::swap(t1, t1);
	EXPECT_EQ(t1.get(),a);
	EXPECT_EQ(t1.use_count(), 1);
}